

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_max_streams(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  int iVar1;
  quicly_send_context_t *s_00;
  quicly_maxsender_t *m;
  uint8_t *puVar2;
  long in_RDX;
  quicly_state_t in_ESI;
  long *in_RDI;
  quicly_sent_t *sent;
  uint64_t new_count;
  int ret;
  st_quicly_conn_streamgroup_state_t *group;
  quicly_maxsender_t *maxsender;
  quicly_sent_acked_cb acked;
  long *min_space;
  undefined8 in_stack_ffffffffffffffb0;
  quicly_conn_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  iVar1 = should_send_max_streams
                    (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == QUICLY_STATE_FIRSTFLIGHT) {
      s_00 = (quicly_send_context_t *)(in_RDI + 0xb3);
      min_space = in_RDI + 0x4e;
    }
    else {
      s_00 = (quicly_send_context_t *)(in_RDI + 0xaf);
      min_space = in_RDI + 0x50;
    }
    m = (quicly_maxsender_t *)(min_space[1] / 4);
    if (in_ESI == QUICLY_STATE_FIRSTFLIGHT) {
      acked = *(quicly_sent_acked_cb *)(*in_RDI + 0x48);
    }
    else {
      acked = *(quicly_sent_acked_cb *)(*in_RDI + 0x50);
    }
    local_4 = allocate_ack_eliciting_frame
                        (in_stack_ffffffffffffffb8,s_00,(size_t)min_space,(quicly_sent_t **)m,acked)
    ;
    if (local_4 == 0) {
      puVar2 = quicly_encode_max_streams_frame((uint8_t *)m,(int)((ulong)acked >> 0x20),0x144379);
      *(uint8_t **)(in_RDX + 0x58) = puVar2;
      (in_stack_ffffffffffffffb8->super).state = in_ESI;
      quicly_maxsender_record(m,(int64_t)acked,(quicly_maxsender_sent_t *)0x1443ad);
      if (in_ESI == QUICLY_STATE_FIRSTFLIGHT) {
        in_RDI[0x7b] = in_RDI[0x7b] + 1;
      }
      else {
        in_RDI[0x7c] = in_RDI[0x7c] + 1;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int send_max_streams(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    if (!should_send_max_streams(conn, uni))
        return 0;

    quicly_maxsender_t *maxsender = uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    struct st_quicly_conn_streamgroup_state_t *group = uni ? &conn->super.remote.uni : &conn->super.remote.bidi;
    int ret;

    uint64_t new_count =
        group->next_stream_id / 4 +
        (uni ? conn->super.ctx->transport_params.max_streams_uni : conn->super.ctx->transport_params.max_streams_bidi) -
        group->num_streams;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_MAX_STREAMS_FRAME_CAPACITY, &sent, on_ack_max_streams)) != 0)
        return ret;
    s->dst = quicly_encode_max_streams_frame(s->dst, uni, new_count);
    sent->data.max_streams.uni = uni;
    quicly_maxsender_record(maxsender, new_count, &sent->data.max_streams.args);

    if (uni) {
        ++conn->super.stats.num_frames_sent.max_streams_uni;
    } else {
        ++conn->super.stats.num_frames_sent.max_streams_bidi;
    }
    QUICLY_PROBE(MAX_STREAMS_SEND, conn, conn->stash.now, new_count, uni);

    return 0;
}